

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_daemon.c
# Opt level: O3

int daemon_init(char *pidfile)

{
  int iVar1;
  __pid_t _Var2;
  int iVar3;
  uint uVar4;
  ulong in_RAX;
  FILE *pFVar5;
  int *piVar6;
  char *pcVar7;
  int pid;
  undefined8 local_28;
  
  local_28 = in_RAX & 0xffffffff00000000;
  pFVar5 = fopen(pidfile,"r");
  if (pFVar5 == (FILE *)0x0) {
LAB_00113b80:
    iVar3 = daemon(1,0);
    if (iVar3 != 0) {
      daemon_init_cold_1();
      return 1;
    }
    local_28 = local_28 & 0xffffffff;
    iVar3 = open(pidfile,0x42,0x1a4);
    if (iVar3 == -1) {
      pcVar7 = "Can\'t create %s.\n";
    }
    else {
      pFVar5 = fdopen(iVar3,"r+");
      if (pFVar5 != (FILE *)0x0) {
        iVar3 = flock(iVar3,6);
        if (iVar3 != -1) {
          uVar4 = getpid();
          iVar3 = fprintf(pFVar5,"%d\n",(ulong)uVar4);
          if (iVar3 == 0) {
            daemon_init_cold_2();
            return 1;
          }
          fflush(pFVar5);
          if (uVar4 == 0) {
            return 1;
          }
          return 0;
        }
        iVar3 = __isoc99_fscanf(pFVar5,"%d",(long)&local_28 + 4);
        fclose(pFVar5);
        if (iVar3 != 1) {
          daemon_init_cold_3();
          return 1;
        }
        pcVar7 = "Can\'t lock pidfile, lock is held by pid %d.\n";
        uVar4 = local_28._4_4_;
        goto LAB_00113cb5;
      }
      pcVar7 = "Can\'t open %s.\n";
    }
    fprintf(_stderr,pcVar7,pidfile);
  }
  else {
    iVar1 = __isoc99_fscanf(pFVar5,"%d",&local_28);
    fclose(pFVar5);
    iVar3 = (uint)local_28;
    if (((uint)local_28 == 0 || iVar1 != 1) || (_Var2 = getpid(), iVar3 == _Var2))
    goto LAB_00113b80;
    iVar3 = kill((uint)local_28,0);
    if (((iVar3 != 0) && (piVar6 = __errno_location(), *piVar6 == 3)) || ((uint)local_28 == 0))
    goto LAB_00113b80;
    pcVar7 = "Skynet is already running, pid = %d.\n";
    uVar4 = (uint)local_28;
LAB_00113cb5:
    fprintf(_stderr,pcVar7,(ulong)uVar4);
  }
  return 1;
}

Assistant:

int
daemon_init(const char *pidfile) {
	int pid = check_pid(pidfile);

	if (pid) {
		fprintf(stderr, "Skynet is already running, pid = %d.\n", pid);
		return 1;
	}

#ifdef __APPLE__
	fprintf(stderr, "'daemon' is deprecated: first deprecated in OS X 10.5 , use launchd instead.\n");
#else
	if (daemon(1,0)) {
		fprintf(stderr, "Can't daemonize.\n");
		return 1;
	}
#endif

	pid = write_pid(pidfile);
	if (pid == 0) {
		return 1;
	}

	return 0;
}